

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRange.h
# Opt level: O1

bool __thiscall
cmRange<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>::
none_of<testRange(int,char**)::__2>
          (cmRange<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
           *this)

{
  int *piVar1;
  int *piVar2;
  int *piVar3;
  long lVar4;
  
  piVar2 = *(int **)this;
  piVar1 = *(int **)(this + 8);
  lVar4 = (long)piVar1 - (long)piVar2 >> 4;
  piVar3 = piVar2;
  if (0 < lVar4) {
    piVar3 = (int *)(((long)piVar1 - (long)piVar2 & 0xfffffffffffffff0U) + (long)piVar2);
    lVar4 = lVar4 + 1;
    piVar2 = piVar2 + 2;
    do {
      if (0xb < piVar2[-2]) {
        piVar2 = piVar2 + -2;
        goto LAB_0013e31e;
      }
      if (0xb < piVar2[-1]) {
        piVar2 = piVar2 + -1;
        goto LAB_0013e31e;
      }
      if (0xb < *piVar2) goto LAB_0013e31e;
      if (0xb < piVar2[1]) {
        piVar2 = piVar2 + 1;
        goto LAB_0013e31e;
      }
      lVar4 = lVar4 + -1;
      piVar2 = piVar2 + 4;
    } while (1 < lVar4);
  }
  lVar4 = (long)piVar1 - (long)piVar3 >> 2;
  if (lVar4 != 1) {
    if (lVar4 != 2) {
      piVar2 = piVar1;
      if ((lVar4 != 3) || (piVar2 = piVar3, 0xb < *piVar3)) goto LAB_0013e31e;
      piVar3 = piVar3 + 1;
    }
    piVar2 = piVar3;
    if (0xb < *piVar3) goto LAB_0013e31e;
    piVar3 = piVar3 + 1;
  }
  piVar2 = piVar3;
  if (*piVar3 < 0xc) {
    piVar2 = piVar1;
  }
LAB_0013e31e:
  return piVar2 == piVar1;
}

Assistant:

bool none_of(UnaryPredicate p) const
  {
    return std::none_of(this->Begin, this->End, std::ref(p));
  }